

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderVkImpl.hpp
# Opt level: O0

Uint32 __thiscall Diligent::ShaderVkImpl::GetResourceCount(ShaderVkImpl *this)

{
  bool bVar1;
  Char *Message;
  element_type *this_00;
  Uint32 local_54;
  undefined1 local_30 [8];
  string msg;
  ShaderVkImpl *this_local;
  
  msg.field_2._8_8_ = this;
  bVar1 = ShaderBase<Diligent::EngineVkImplTraits>::IsCompiling
                    (&this->super_ShaderBase<Diligent::EngineVkImplTraits>);
  if (bVar1) {
    FormatString<char[109]>
              ((string *)local_30,
               (char (*) [109])
               "Shader resources are not available until the shader is compiled. Use GetStatus() to check the shader status."
              );
    Message = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (Message,"GetResourceCount",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/include/ShaderVkImpl.hpp"
               ,0x4a);
    std::__cxx11::string::~string((string *)local_30);
  }
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&this->m_pShaderResources);
  if (bVar1) {
    this_00 = std::
              __shared_ptr_access<const_Diligent::SPIRVShaderResources,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<const_Diligent::SPIRVShaderResources,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)&this->m_pShaderResources);
    local_54 = SPIRVShaderResources::GetTotalResources(this_00);
  }
  else {
    local_54 = 0;
  }
  return local_54;
}

Assistant:

GetResourceCount() const override final
    {
        DEV_CHECK_ERR(!IsCompiling(), "Shader resources are not available until the shader is compiled. Use GetStatus() to check the shader status.");
        return m_pShaderResources ? m_pShaderResources->GetTotalResources() : 0;
    }